

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O3

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>
          (SafeOrderList<ncnn::ObjectBox> *this,ObjectBoxNmsCondition match)

{
  size_t *psVar1;
  SafeOrderList<ncnn::ObjectBox> *pSVar2;
  ObjectBox *this_00;
  _Self __tmp;
  SafeOrderList<ncnn::ObjectBox> *pSVar3;
  float fVar4;
  
  this_00 = match.top_box;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  pSVar3 = (SafeOrderList<ncnn::ObjectBox> *)
           (this->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
           _M_impl._M_node.super__List_node_base._M_next;
LAB_0016ce0a:
  do {
    if (pSVar3 == this) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
      return;
    }
    if ((this_00->classid == (pSVar3->mutex).mutex.__data.__count) &&
       (*(float *)&(pSVar3->mutex).mutex <= this_00->prob &&
        this_00->prob != *(float *)&(pSVar3->mutex).mutex)) {
      fVar4 = ObjectBox::box_iou(this_00,(ObjectBox *)
                                         &(pSVar3->container).
                                          super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                          ._M_impl._M_node._M_size);
      if (match.nms_threshold < fVar4) {
        pSVar2 = (SafeOrderList<ncnn::ObjectBox> *)
                 (pSVar3->container).
                 super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl._M_node
                 .super__List_node_base._M_next;
        psVar1 = &(this->container).
                  super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pSVar3,0x28);
        pSVar3 = pSVar2;
        goto LAB_0016ce0a;
      }
    }
    pSVar3 = (SafeOrderList<ncnn::ObjectBox> *)
             (pSVar3->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
             ._M_impl._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

void remove_all_match(MatchFun match)
  {
    MutexLockGuard guard(mutex);
    Iterator iter = container.begin();
    for (; iter != container.end();)
    {
      if (match(*iter))
        container.erase(iter++);
      else
        iter++;
    }
  }